

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_map_get_value_t.c
# Opt level: O3

void run_tests(int mode,char *mode_desc)

{
  int a;
  char *db_file;
  MMDB_s *mmdb;
  MMDB_lookup_result_s result;
  MMDB_entry_data_s entry_data;
  MMDB_lookup_result_s local_78;
  MMDB_entry_data_s local_58;
  
  db_file = test_database_path("MaxMind-DB-string-value-entries.mmdb");
  mmdb = open_ok(db_file,mode,mode_desc);
  free(db_file);
  lookup_string_ok(&local_78,mmdb,"1.1.1.1","MaxMind-DB-string-value-entries.mmdb",mode_desc);
  a = MMDB_get_value(&local_78.entry,&local_58,0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/no_map_get_value_t.c"
                ,0x13,a,"==",0,"status for MMDB_get_value() is MMDB_SUCCESS",0);
  ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/no_map_get_value_t.c"
            ,0x14,(uint)local_58.has_data,"found a value when varargs list is just NULL",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/no_map_get_value_t.c"
                ,0x18,local_58.type,"==",2,"returned entry type is utf8_string",0);
  MMDB_close(mmdb);
  free(mmdb);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "MaxMind-DB-string-value-entries.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    const char *ip = "1.1.1.1";
    MMDB_lookup_result_s result =
        lookup_string_ok(mmdb, ip, filename, mode_desc);

    MMDB_entry_data_s entry_data;
    int status = MMDB_get_value(&result.entry, &entry_data, NULL);

    cmp_ok(status,
           "==",
           MMDB_SUCCESS,
           "status for MMDB_get_value() is MMDB_SUCCESS");
    ok(entry_data.has_data, "found a value when varargs list is just NULL");
    cmp_ok(entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "returned entry type is utf8_string");

    MMDB_close(mmdb);
    free(mmdb);
}